

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClusterList.h
# Opt level: O2

void __thiscall
SegmentClusterList<unsigned_int,_Memory::JitArenaAllocator,_16U>::Dump
          (SegmentClusterList<unsigned_int,_Memory::JitArenaAllocator,_16U> *this)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  uint j;
  int iVar4;
  uint index;
  int iVar5;
  
  bVar1 = false;
  Output::Print(L"[");
  iVar5 = 0;
  for (uVar3 = 0; uVar3 < this->maxIndex >> 4; uVar3 = uVar3 + 1) {
    if (this->backingStore[uVar3] != (uint *)0x0) {
      for (iVar4 = 0; iVar4 != 0x10; iVar4 = iVar4 + 1) {
        index = iVar5 + iVar4;
        uVar2 = SegmentClusterList<unsigned_int,Memory::JitArenaAllocator,16u>::Lookup<false,true>
                          ((SegmentClusterList<unsigned_int,Memory::JitArenaAllocator,16u> *)this,
                           index);
        if (index != uVar2) {
          if (bVar1) {
            Output::Print(L", ");
          }
          Output::Print(L"%u <= %u",(ulong)uVar2,(ulong)index);
          bVar1 = true;
        }
      }
    }
    iVar5 = iVar5 + 0x10;
  }
  Output::Print(L"]\n");
  return;
}

Assistant:

void Dump()
    {
        bool printed = false;
        Output::Print(_u("["));
        for (indexType i = 0; i < maxIndex / numPerSegment; i++)
        {
            if (backingStore[i] == nullptr)
            {
                continue;
            }
            for (indexType j = 0; j < numPerSegment; j++)
            {
                indexType index = i * numPerSegment + j;
                indexType local = Lookup<false, true>(index);
                if (index != local)
                {
                    if (printed)
                    {
                        Output::Print(_u(", "));
                    }
                    Output::Print(_u("%u <= %u"), local, index);
                    printed = true;
                }
            }
        }
        Output::Print(_u("]\n"));
    }